

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O3

void __thiscall
wasm::ABI::getStackSpace(ABI *this,Index local,Function *func,Index size,Module *wasm)

{
  pointer *this_00;
  Builder *ast;
  pointer puVar1;
  Expression **ppEVar2;
  size_t sVar3;
  char *pcVar4;
  undefined8 uVar5;
  pointer puVar6;
  pointer puVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Index index;
  Id index_00;
  Global *pGVar10;
  Module *pMVar11;
  Expression *pEVar12;
  LocalSet *pLVar13;
  Const *pCVar14;
  Binary *this_01;
  GlobalSet *pGVar15;
  Expression *pEVar16;
  Block *this_02;
  undefined4 *puVar17;
  undefined1 auVar18 [8];
  pointer puVar19;
  Module *this_03;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  Builder *this_04;
  uintptr_t uVar20;
  Id index_01;
  MixedArena *pMVar21;
  ExpressionList *this_05;
  Signature SVar22;
  undefined1 local_230 [8];
  FindAllPointers<wasm::Return> finder;
  Builder local_38;
  Builder builder;
  
  this_04 = (Builder *)CONCAT44(in_register_00000034,local);
  pMVar11 = (Module *)CONCAT44(in_register_0000000c,size);
  pGVar10 = getStackPointerGlobal(pMVar11);
  if (pGVar10 == (Global *)0x0) {
    Fatal::Fatal((Fatal *)local_230);
    Fatal::operator<<((Fatal *)local_230,
                      (char (*) [48])"getStackSpace: failed to find the stack pointer");
    Fatal::~Fatal((Fatal *)local_230);
  }
  puVar1 = (pMVar11->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar1 == (pMVar11->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    uVar20 = 2;
  }
  else {
    uVar20 = (((puVar1->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->indexType).id;
  }
  pMVar21 = &pMVar11->allocator;
  local_38.wasm = pMVar11;
  pMVar11 = (Module *)MixedArena::allocSpace(pMVar21,0x40,8);
  *(Id *)&(pMVar11->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = BlockId;
  ((Type *)&(pMVar11->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->id = 0;
  (pMVar11->exports).
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pMVar11->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pMVar11->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pMVar11->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pMVar11->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pMVar11->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pMVar21;
  this_00 = &(pMVar11->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  sVar3 = (pGVar10->super_Importable).super_Named.name.super_IString.str._M_len;
  pcVar4 = (pGVar10->super_Importable).super_Named.name.super_IString.str._M_str;
  pEVar12 = (Expression *)MixedArena::allocSpace(pMVar21,0x20,8);
  pEVar12->_id = GlobalGetId;
  *(size_t *)(pEVar12 + 1) = sVar3;
  pEVar12[1].type.id = (uintptr_t)pcVar4;
  (pEVar12->type).id = uVar20;
  index_01 = (Id)this;
  pLVar13 = Builder::makeLocalSet(&local_38,index_01,pEVar12);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
             (Expression *)pLVar13);
  if (uVar20 != 2) {
    handle_unreachable("unhandled pointerType",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/abi/stack.h"
                       ,0x44);
  }
  pEVar12 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar12->_id = LocalGetId;
  pEVar12[1]._id = index_01;
  (pEVar12->type).id = 2;
  pCVar14 = Builder::makeConst<int>(&local_38,(int)func + 0xfU & 0xfffffff0);
  this_01 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_01->op = SubInt32;
  this_01->left = pEVar12;
  this_01->right = (Expression *)pCVar14;
  Binary::finalize(this_01);
  sVar3 = (pGVar10->super_Importable).super_Named.name.super_IString.str._M_len;
  pcVar4 = (pGVar10->super_Importable).super_Named.name.super_IString.str._M_str;
  pGVar15 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (pGVar15->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id = GlobalSetId;
  (pGVar15->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
  (pGVar15->name).super_IString.str._M_len = sVar3;
  (pGVar15->name).super_IString.str._M_str = pcVar4;
  pGVar15->value = (Expression *)this_01;
  GlobalSet::finalize(pGVar15);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
             (Expression *)pGVar15);
  ast = this_04 + 0xc;
  FindAllPointers<wasm::Return>::FindAllPointers
            ((FindAllPointers<wasm::Return> *)local_230,(Expression **)ast);
  for (auVar18 = local_230;
      auVar18 !=
      (undefined1  [8])
      finder.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
      _M_impl.super__Vector_impl_data._M_start; auVar18 = (undefined1  [8])((long)auVar18 + 8)) {
    ppEVar2 = *(Expression ***)auVar18;
    pEVar12 = *ppEVar2;
    if (pEVar12->_id != ReturnId) {
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,"T *wasm::Expression::cast() [T = wasm::Return]");
    }
    if ((*(long *)(pEVar12 + 1) == 0) || (*(long *)(*(long *)(pEVar12 + 1) + 8) == 1)) {
      sVar3 = (pGVar10->super_Importable).super_Named.name.super_IString.str._M_len;
      pcVar4 = (pGVar10->super_Importable).super_Named.name.super_IString.str._M_str;
      pEVar16 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar16->_id = LocalGetId;
      pEVar16[1]._id = index_01;
      (pEVar16->type).id = 2;
      pGVar15 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pGVar15->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
           GlobalSetId;
      (pGVar15->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
      (pGVar15->name).super_IString.str._M_len = sVar3;
      (pGVar15->name).super_IString.str._M_str = pcVar4;
      pGVar15->value = pEVar16;
      GlobalSet::finalize(pGVar15);
      this_02 = Builder::makeBlock(&local_38,(Expression *)pGVar15);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(this_02->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar12
                );
      Block::finalize(this_02);
    }
    else {
      pMVar21 = &(local_38.wasm)->allocator;
      this_02 = (Block *)MixedArena::allocSpace(pMVar21,0x40,8);
      (this_02->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
      (this_02->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (this_02->name).super_IString.str._M_len = 0;
      (this_02->name).super_IString.str._M_str = (char *)0x0;
      (this_02->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (this_02->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      (this_02->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      (this_02->list).allocator = pMVar21;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(*(long *)(pEVar12 + 1) + 8);
      index = Builder::addVar(this_04,(Function *)0x0,(Name)(auVar8 << 0x40),(Type)wasm);
      pLVar13 = Builder::makeLocalSet(&local_38,index,*(Expression **)(pEVar12 + 1));
      this_05 = &this_02->list;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_05->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pLVar13);
      sVar3 = (pGVar10->super_Importable).super_Named.name.super_IString.str._M_len;
      pcVar4 = (pGVar10->super_Importable).super_Named.name.super_IString.str._M_str;
      pEVar16 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar16->_id = LocalGetId;
      pEVar16[1]._id = index_01;
      (pEVar16->type).id = 2;
      pGVar15 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pGVar15->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
           GlobalSetId;
      (pGVar15->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
      (pGVar15->name).super_IString.str._M_len = sVar3;
      (pGVar15->name).super_IString.str._M_str = pcVar4;
      pGVar15->value = pEVar16;
      GlobalSet::finalize(pGVar15);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_05->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pGVar15);
      uVar5 = *(undefined8 *)(*(long *)(pEVar12 + 1) + 8);
      puVar17 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      *puVar17 = 8;
      puVar17[4] = index;
      *(undefined8 *)(puVar17 + 2) = uVar5;
      pEVar12 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar12->_id = ReturnId;
      (pEVar12->type).id = 1;
      *(undefined4 **)(pEVar12 + 1) = puVar17;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_05->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar12
                );
      Block::finalize(this_02);
    }
    *ppEVar2 = (Expression *)this_02;
  }
  this_03 = ast->wasm;
  uVar20 = ((Type *)&(this_03->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->id;
  if (uVar20 == 0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
               (Expression *)this_03);
    puVar6 = (pointer)(pGVar10->super_Importable).super_Named.name.super_IString.str._M_len;
    puVar7 = (pointer)(pGVar10->super_Importable).super_Named.name.super_IString.str._M_str;
    puVar19 = (pointer)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    *(undefined4 *)
     &(puVar19->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
      _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = 8;
    *(Id *)&puVar19[2]._M_t.
            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = index_01;
    puVar19[1]._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false> = (_Head_base<0UL,_wasm::Function_*,_false>)0x2;
    this_03 = (Module *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    *(Id *)&(this_03->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = GlobalSetId;
    ((Type *)&(this_03->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->id = 0;
    (this_03->exports).
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar6;
    (this_03->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar7;
    (this_03->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar19;
    GlobalSet::finalize((GlobalSet *)this_03);
  }
  else if (uVar20 != 1) {
    SVar22 = HeapType::getSignature((HeapType *)(this_04 + 7));
    auVar9._8_8_ = 0;
    auVar9._0_8_ = SVar22.results.id.id;
    index_00 = Builder::addVar(this_04,(Function *)0x0,(Name)(auVar9 << 0x40),(Type)wasm);
    pLVar13 = Builder::makeLocalSet(&local_38,index_00,(Expression *)ast->wasm);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
               (Expression *)pLVar13);
    sVar3 = (pGVar10->super_Importable).super_Named.name.super_IString.str._M_len;
    pcVar4 = (pGVar10->super_Importable).super_Named.name.super_IString.str._M_str;
    pEVar12 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar12->_id = LocalGetId;
    pEVar12[1]._id = index_01;
    (pEVar12->type).id = 2;
    pGVar15 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (pGVar15->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id = GlobalSetId
    ;
    (pGVar15->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
    (pGVar15->name).super_IString.str._M_len = sVar3;
    (pGVar15->name).super_IString.str._M_str = pcVar4;
    pGVar15->value = pEVar12;
    GlobalSet::finalize(pGVar15);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
               (Expression *)pGVar15);
    SVar22 = HeapType::getSignature((HeapType *)(this_04 + 7));
    pEVar12 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar12->_id = LocalGetId;
    pEVar12[1]._id = index_00;
    (pEVar12->type).id = SVar22.results.id.id;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
               pEVar12);
    goto LAB_0092790c;
  }
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
             (Expression *)this_03);
LAB_0092790c:
  Block::finalize((Block *)pMVar11);
  ast->wasm = pMVar11;
  if (local_230 != (undefined1  [8])0x0) {
    operator_delete((void *)local_230,
                    (long)finder.list.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_230);
  }
  return;
}

Assistant:

inline void
getStackSpace(Index local, Function* func, Index size, Module& wasm) {
  auto* stackPointer = getStackPointerGlobal(wasm);
  if (!stackPointer) {
    Fatal() << "getStackSpace: failed to find the stack pointer";
  }
  // align the size
  size = stackAlign(size);
  auto pointerType =
    !wasm.memories.empty() ? wasm.memories[0]->indexType : Type::i32;
  // TODO: find existing stack usage, and add on top of that - carefully
  Builder builder(wasm);
  auto* block = builder.makeBlock();
  block->list.push_back(builder.makeLocalSet(
    local, builder.makeGlobalGet(stackPointer->name, pointerType)));
  // TODO: add stack max check
  Expression* added;
  if (pointerType == Type::i32) {
    // The stack goes downward in the LLVM wasm backend.
    added = builder.makeBinary(SubInt32,
                               builder.makeLocalGet(local, pointerType),
                               builder.makeConst(int32_t(size)));
  } else {
    WASM_UNREACHABLE("unhandled pointerType");
  }
  block->list.push_back(builder.makeGlobalSet(stackPointer->name, added));
  auto makeStackRestore = [&]() {
    return builder.makeGlobalSet(stackPointer->name,
                                 builder.makeLocalGet(local, pointerType));
  };
  // add stack restores to the returns
  FindAllPointers<Return> finder(func->body);
  for (auto** ptr : finder.list) {
    auto* ret = (*ptr)->cast<Return>();
    if (ret->value && ret->value->type != Type::unreachable) {
      // handle the returned value
      auto* block = builder.makeBlock();
      auto temp = builder.addVar(func, ret->value->type);
      block->list.push_back(builder.makeLocalSet(temp, ret->value));
      block->list.push_back(makeStackRestore());
      block->list.push_back(
        builder.makeReturn(builder.makeLocalGet(temp, ret->value->type)));
      block->finalize();
      *ptr = block;
    } else {
      // restore, then return
      *ptr = builder.makeSequence(makeStackRestore(), ret);
    }
  }
  // add stack restores to the body
  if (func->body->type == Type::none) {
    block->list.push_back(func->body);
    block->list.push_back(makeStackRestore());
  } else if (func->body->type == Type::unreachable) {
    block->list.push_back(func->body);
    // no need to restore the old stack value, we're gone anyhow
  } else {
    // save the return value
    auto temp = builder.addVar(func, func->getResults());
    block->list.push_back(builder.makeLocalSet(temp, func->body));
    block->list.push_back(makeStackRestore());
    block->list.push_back(builder.makeLocalGet(temp, func->getResults()));
  }
  block->finalize();
  func->body = block;
}